

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

void __thiscall
vkt::sr::ShaderRenderCaseInstance::setupDefaultInputs(ShaderRenderCaseInstance *this)

{
  BaseAttributeType BVar1;
  int iVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  QuadGrid *this_00;
  Vec4 *pVVar5;
  float *dataPtr;
  size_type sVar6;
  reference pvVar7;
  int local_30;
  int colNdx;
  int numCols;
  int matNdx;
  int userNdx;
  size_t attrNdx;
  QuadGrid *quadGrid;
  ShaderRenderCaseInstance *this_local;
  
  this_00 = de::details::UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>::
            operator*(&(this->m_quadGrid).
                       super_UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>);
  dVar3 = QuadGrid::getNumVertices(this_00);
  pVVar5 = QuadGrid::getPositions(this_00);
  addAttribute(this,0,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,dVar3,pVVar5);
  dVar3 = QuadGrid::getNumVertices(this_00);
  pVVar5 = QuadGrid::getCoords(this_00);
  addAttribute(this,1,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,dVar3,pVVar5);
  dVar3 = QuadGrid::getNumVertices(this_00);
  pVVar5 = QuadGrid::getUnitCoords(this_00);
  addAttribute(this,2,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,dVar3,pVVar5);
  dVar3 = QuadGrid::getNumVertices(this_00);
  dataPtr = QuadGrid::getAttribOne(this_00);
  addAttribute(this,3,VK_FORMAT_R32_SFLOAT,4,dVar3,dataPtr);
  for (_matNdx = 0;
      sVar6 = std::
              vector<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute,_std::allocator<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute>_>
              ::size(&this->m_enabledBaseAttributes), _matNdx < sVar6; _matNdx = _matNdx + 1) {
    for (numCols = 0; numCols < 4; numCols = numCols + 1) {
      BVar1 = setupDefaultInputs::userAttributes[numCols].type;
      pvVar7 = std::
               vector<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute,_std::allocator<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute>_>
               ::operator[](&this->m_enabledBaseAttributes,_matNdx);
      if (BVar1 == pvVar7->type) {
        pvVar7 = std::
                 vector<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute,_std::allocator<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute>_>
                 ::operator[](&this->m_enabledBaseAttributes,_matNdx);
        dVar3 = pvVar7->location;
        dVar4 = QuadGrid::getNumVertices(this_00);
        pVVar5 = QuadGrid::getUserAttrib(this_00,numCols);
        addAttribute(this,dVar3,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,dVar4,pVVar5);
      }
    }
    for (colNdx = 0; colNdx < 9; colNdx = colNdx + 1) {
      BVar1 = setupDefaultInputs::matrices[colNdx].matrixType;
      pvVar7 = std::
               vector<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute,_std::allocator<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute>_>
               ::operator[](&this->m_enabledBaseAttributes,_matNdx);
      if (BVar1 == pvVar7->type) {
        iVar2 = setupDefaultInputs::matrices[colNdx].numCols;
        for (local_30 = 0; local_30 < iVar2; local_30 = local_30 + 1) {
          pvVar7 = std::
                   vector<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute,_std::allocator<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute>_>
                   ::operator[](&this->m_enabledBaseAttributes,_matNdx);
          dVar3 = pvVar7->location;
          dVar4 = QuadGrid::getNumVertices(this_00);
          pVVar5 = QuadGrid::getUserAttrib(this_00,local_30);
          addAttribute(this,dVar3 + local_30,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,dVar4,pVVar5);
        }
      }
    }
  }
  return;
}

Assistant:

void ShaderRenderCaseInstance::setupDefaultInputs (void)
{
	/* Configuration of the vertex input attributes:
		a_position   is at location 0
		a_coords     is at location 1
		a_unitCoords is at location 2
		a_one        is at location 3

	  User attributes starts from at the location 4.
	*/

	DE_ASSERT(m_quadGrid);
	const QuadGrid&		quadGrid	= *m_quadGrid;

	addAttribute(0u, VK_FORMAT_R32G32B32A32_SFLOAT, sizeof(tcu::Vec4), quadGrid.getNumVertices(), quadGrid.getPositions());
	addAttribute(1u, VK_FORMAT_R32G32B32A32_SFLOAT, sizeof(tcu::Vec4), quadGrid.getNumVertices(), quadGrid.getCoords());
	addAttribute(2u, VK_FORMAT_R32G32B32A32_SFLOAT, sizeof(tcu::Vec4), quadGrid.getNumVertices(), quadGrid.getUnitCoords());
	addAttribute(3u, VK_FORMAT_R32_SFLOAT, sizeof(float), quadGrid.getNumVertices(), quadGrid.getAttribOne());

	static const struct
	{
		BaseAttributeType	type;
		int					userNdx;
	} userAttributes[] =
	{
		{ A_IN0, 0 },
		{ A_IN1, 1 },
		{ A_IN2, 2 },
		{ A_IN3, 3 }
	};

	static const struct
	{
		BaseAttributeType	matrixType;
		int					numCols;
		int					numRows;
	} matrices[] =
	{
		{ MAT2,		2, 2 },
		{ MAT2x3,	2, 3 },
		{ MAT2x4,	2, 4 },
		{ MAT3x2,	3, 2 },
		{ MAT3,		3, 3 },
		{ MAT3x4,	3, 4 },
		{ MAT4x2,	4, 2 },
		{ MAT4x3,	4, 3 },
		{ MAT4,		4, 4 }
	};

	for (size_t attrNdx = 0; attrNdx < m_enabledBaseAttributes.size(); attrNdx++)
	{
		for (int userNdx = 0; userNdx < DE_LENGTH_OF_ARRAY(userAttributes); userNdx++)
		{
			if (userAttributes[userNdx].type != m_enabledBaseAttributes[attrNdx].type)
				continue;

			addAttribute(m_enabledBaseAttributes[attrNdx].location, VK_FORMAT_R32G32B32A32_SFLOAT, sizeof(tcu::Vec4), quadGrid.getNumVertices(), quadGrid.getUserAttrib(userNdx));
		}

		for (int matNdx = 0; matNdx < DE_LENGTH_OF_ARRAY(matrices); matNdx++)
		{

			if (matrices[matNdx].matrixType != m_enabledBaseAttributes[attrNdx].type)
				continue;

			const int numCols = matrices[matNdx].numCols;

			for (int colNdx = 0; colNdx < numCols; colNdx++)
			{
				addAttribute(m_enabledBaseAttributes[attrNdx].location + colNdx, VK_FORMAT_R32G32B32A32_SFLOAT, (deUint32)(4 * sizeof(float)), quadGrid.getNumVertices(), quadGrid.getUserAttrib(colNdx));
			}
		}
	}
}